

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

int __thiscall vkt::ubo::UniformBlockCase::init(UniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  key_type_conflict kVar1;
  bool bVar2;
  int iVar3;
  pointer pBVar4;
  size_type sVar5;
  mapped_type *ppvVar6;
  reference pvVar7;
  undefined1 shuffleUniformMembers;
  reference in_stack_ffffffffffffff68;
  string local_80;
  string local_60;
  key_type_conflict local_40;
  int local_3c;
  int blockNdx;
  int curOffset;
  __normal_iterator<vkt::ubo::BlockLayoutEntry_*,_std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>_>
  local_30;
  __normal_iterator<vkt::ubo::BlockLayoutEntry_*,_std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>_>
  local_28;
  __normal_iterator<const_vkt::ubo::BlockLayoutEntry_*,_std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>_>
  local_20;
  const_iterator blockIter;
  int totalSize;
  UniformBlockCase *this_local;
  
  ubo::anon_unknown_0::computeStd140Layout(&this->m_uniformLayout,&this->m_interface);
  blockIter._M_current._4_4_ = 0;
  local_28._M_current =
       (BlockLayoutEntry *)
       std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::begin
                 (&(this->m_uniformLayout).blocks);
  __gnu_cxx::
  __normal_iterator<vkt::ubo::BlockLayoutEntry_const*,std::vector<vkt::ubo::BlockLayoutEntry,std::allocator<vkt::ubo::BlockLayoutEntry>>>
  ::__normal_iterator<vkt::ubo::BlockLayoutEntry*>
            ((__normal_iterator<vkt::ubo::BlockLayoutEntry_const*,std::vector<vkt::ubo::BlockLayoutEntry,std::allocator<vkt::ubo::BlockLayoutEntry>>>
              *)&local_20,&local_28);
  while( true ) {
    local_30._M_current =
         (BlockLayoutEntry *)
         std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::end
                   (&(this->m_uniformLayout).blocks);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar2) break;
    pBVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::ubo::BlockLayoutEntry_*,_std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>_>
             ::operator->(&local_20);
    blockIter._M_current._4_4_ = pBVar4->size + blockIter._M_current._4_4_;
    _blockNdx = __gnu_cxx::
                __normal_iterator<const_vkt::ubo::BlockLayoutEntry_*,_std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>_>
                ::operator++(&local_20,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,(long)blockIter._M_current._4_4_);
  local_3c = 0;
  local_40 = 0;
  while( true ) {
    kVar1 = local_40;
    shuffleUniformMembers = SUB81(in_stack_ffffffffffffff68,0);
    sVar5 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
            size(&(this->m_uniformLayout).blocks);
    if ((int)sVar5 <= kVar1) break;
    in_stack_ffffffffffffff68 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
    in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + local_3c;
    ppvVar6 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
              ::operator[](&this->m_blockPointers,&local_40);
    *ppvVar6 = in_stack_ffffffffffffff68;
    pvVar7 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
             operator[](&(this->m_uniformLayout).blocks,(long)local_40);
    local_3c = pvVar7->size + local_3c;
    local_40 = local_40 + 1;
  }
  ubo::anon_unknown_0::generateValues(&this->m_uniformLayout,&this->m_blockPointers,1);
  ubo::(anonymous_namespace)::generateVertexShader_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)&this->m_interface,
             (ShaderInterface *)&this->m_uniformLayout,(UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             (ulong)this->m_matrixLoadFlag,(uint)(this->m_shuffleUniformMembers & 1),
             (bool)shuffleUniformMembers);
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  ubo::(anonymous_namespace)::generateFragmentShader_abi_cxx11_
            (&local_80,(_anonymous_namespace_ *)&this->m_interface,
             (ShaderInterface *)&this->m_uniformLayout,(UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             (ulong)this->m_matrixLoadFlag,(uint)(this->m_shuffleUniformMembers & 1),
             (bool)shuffleUniformMembers);
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,(string *)&local_80);
  iVar3 = std::__cxx11::string::~string((string *)&local_80);
  return iVar3;
}

Assistant:

void UniformBlockCase::init (void)
{
	// Compute reference layout.
	computeStd140Layout(m_uniformLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (std::vector<BlockLayoutEntry>::const_iterator blockIter = m_uniformLayout.blocks.begin(); blockIter != m_uniformLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		m_data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)m_uniformLayout.blocks.size(); blockNdx++)
		{
			m_blockPointers[blockNdx] = &m_data[0] + curOffset;
			curOffset += m_uniformLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(m_uniformLayout, m_blockPointers, 1 /* seed */);

	// Generate shaders.
	m_vertShaderSource = generateVertexShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
	m_fragShaderSource = generateFragmentShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
}